

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

int xmlPythonFileWrite(void *context,char *buffer,int len)

{
  int iVar1;
  PyObject *op;
  int local_44;
  PyObject *pPStack_40;
  int written;
  PyObject *ret;
  PyObject *string;
  PyObject *file;
  int len_local;
  char *buffer_local;
  void *context_local;
  
  pPStack_40 = (PyObject *)0x0;
  local_44 = -1;
  if (context == (void *)0x0) {
    context_local._4_4_ = -1;
  }
  else {
    op = (PyObject *)PyUnicode_FromStringAndSize(buffer,(long)len);
    if (op == (PyObject *)0x0) {
      context_local._4_4_ = -1;
    }
    else {
      iVar1 = PyObject_HasAttrString(context,"io_write");
      if (iVar1 == 0) {
        iVar1 = PyObject_HasAttrString(context,"write");
        if (iVar1 != 0) {
          pPStack_40 = (PyObject *)_PyObject_CallMethod_SizeT(context,"write","(O)",op);
        }
      }
      else {
        pPStack_40 = (PyObject *)_PyObject_CallMethod_SizeT(context,"io_write","(O)",op);
      }
      _Py_DECREF(op);
      if (pPStack_40 == (PyObject *)0x0) {
        printf("xmlPythonFileWrite: result is NULL\n");
        context_local._4_4_ = -1;
      }
      else {
        iVar1 = PyType_HasFeature(pPStack_40->ob_type,0x1000000);
        if (iVar1 == 0) {
          if (pPStack_40 == (PyObject *)&_Py_NoneStruct) {
            _Py_DECREF((PyObject *)&_Py_NoneStruct);
            local_44 = len;
          }
          else {
            printf("xmlPythonFileWrite: result is not an Int nor None\n");
            _Py_DECREF(pPStack_40);
          }
        }
        else {
          local_44 = PyLong_AsLong(pPStack_40);
          _Py_DECREF(pPStack_40);
        }
        context_local._4_4_ = local_44;
      }
    }
  }
  return context_local._4_4_;
}

Assistant:

static int
xmlPythonFileWrite (void * context, const char * buffer, int len) {
    PyObject *file;
    PyObject *string;
    PyObject *ret = NULL;
    int written = -1;

#ifdef DEBUG_FILES
    printf("xmlPythonFileWrite: %d\n", len);
#endif
    file = (PyObject *) context;
    if (file == NULL) return(-1);
    string = PY_IMPORT_STRING_SIZE(buffer, len);
    if (string == NULL) return(-1);
    if (PyObject_HasAttrString(file, (char *) "io_write")) {
        ret = PyObject_CallMethod(file, (char *) "io_write", (char *) "(O)",
	                        string);
    } else if (PyObject_HasAttrString(file, (char *) "write")) {
        ret = PyObject_CallMethod(file, (char *) "write", (char *) "(O)",
	                        string);
    }
    Py_DECREF(string);
    if (ret == NULL) {
	printf("xmlPythonFileWrite: result is NULL\n");
	return(-1);
    } else if (PyLong_Check(ret)) {
	written = (int) PyLong_AsLong(ret);
	Py_DECREF(ret);
    } else if (ret == Py_None) {
	written = len;
	Py_DECREF(ret);
    } else {
	printf("xmlPythonFileWrite: result is not an Int nor None\n");
	Py_DECREF(ret);
    }
    return(written);
}